

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_traceback(lua_State *L)

{
  int iVar1;
  lua_State *L1_00;
  char *msg_00;
  lua_Integer lVar2;
  int level;
  char *msg;
  lua_State *L1;
  lua_State *plStack_10;
  int arg;
  lua_State *L_local;
  
  plStack_10 = L;
  L1_00 = getthread(L,(int *)((long)&L1 + 4));
  msg_00 = lua_tolstring(plStack_10,L1._4_4_ + 1,(size_t *)0x0);
  if ((msg_00 == (char *)0x0) && (iVar1 = lua_type(plStack_10,L1._4_4_ + 1), 0 < iVar1)) {
    lua_pushvalue(plStack_10,L1._4_4_ + 1);
  }
  else {
    lVar2 = luaL_optinteger(plStack_10,L1._4_4_ + 2,(long)(int)(uint)(plStack_10 == L1_00));
    luaL_traceback(plStack_10,L1_00,msg_00,(int)lVar2);
  }
  return 1;
}

Assistant:

static int db_traceback (lua_State *L) {
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *msg = lua_tostring(L, arg + 1);
  if (msg == NULL && !lua_isnoneornil(L, arg + 1))  /* non-string 'msg'? */
    lua_pushvalue(L, arg + 1);  /* return it untouched */
  else {
    int level = luaL_optint(L, arg + 2, (L == L1) ? 1 : 0);
    luaL_traceback(L, L1, msg, level);
  }
  return 1;
}